

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveDisplayer.cpp
# Opt level: O0

void __thiscall
PrimitiveDisplayer::PrimitiveDisplayer(PrimitiveDisplayer *this,GLfloat pixelsPerSquare)

{
  Vec2d **ppVVar1;
  GLfloat pixelsPerSquare_local;
  PrimitiveDisplayer *this_local;
  
  this->pixelsPerSquare = 20.0;
  this->pixelsPerSquare = pixelsPerSquare;
  ppVVar1 = (Vec2d **)operator_new__(0x20);
  *ppVVar1 = Vec2d::ORIGIN;
  ppVVar1[1] = Vec2d::EAST;
  ppVVar1[2] = Vec2d::SOUTHEAST;
  ppVVar1[3] = Vec2d::SOUTH;
  this->verticesVec = ppVVar1;
  return;
}

Assistant:

PrimitiveDisplayer::PrimitiveDisplayer(GLfloat pixelsPerSquare) {
    this->pixelsPerSquare = pixelsPerSquare;
    verticesVec = new Vec2d*[4] {
        Vec2d::ORIGIN,
        Vec2d::EAST,
        Vec2d::SOUTHEAST,
        Vec2d::SOUTH
    };
}